

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O1

void fsnav_ins_attitude_madgwick(void)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  char cVar5;
  fsnav_imu *pfVar6;
  bool bVar7;
  ulong uVar8;
  char *__nptr;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double a [3];
  double J_madgwick [3] [4];
  char madgwick_token [23];
  double w_madgwick [4];
  double vector1_4 [4];
  double a_madgwick [3];
  double vector2_4 [4];
  double local_148 [4];
  double local_128;
  undefined8 uStack_120;
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  char local_b8 [32];
  double local_98;
  double adStack_90 [7];
  double local_58 [4];
  double local_38 [4];
  
  dVar13 = fsnav_ins_attitude_madgwick::t0;
  builtin_strncpy(local_b8,"madgwick_feedback_rate",0x17);
  if (fsnav->mode == 0) {
    pfVar6 = fsnav->imu;
    if (pfVar6 != (fsnav_imu *)0x0) {
      (pfVar6->sol).q_valid = '\0';
      (pfVar6->sol).L_valid = '\0';
      (pfVar6->sol).rpy_valid = '\0';
      pdVar1 = (pfVar6->sol).L;
      fsnav_ins_attitude_madgwick::L = pdVar1;
      (pfVar6->sol).q[0] = 1.0;
      (pfVar6->sol).q[1] = 0.0;
      (pfVar6->sol).q[2] = 0.0;
      (pfVar6->sol).q[3] = 0.0;
      (pfVar6->sol).q_valid = '\x01';
      fsnav_linal_quat2mat(pdVar1,(pfVar6->sol).q);
      pfVar6 = fsnav->imu;
      (pfVar6->sol).L_valid = '\x01';
      fsnav_linal_mat2rpy((pfVar6->sol).rpy,fsnav_ins_attitude_madgwick::L);
      pfVar6 = fsnav->imu;
      (pfVar6->sol).rpy_valid = '\x01';
      fsnav_ins_attitude_madgwick::t0 = -1.0;
      __nptr = fsnav_locate_token(local_b8,pfVar6->cfg,pfVar6->cfglength,'=');
      if (__nptr != (char *)0x0) {
        dVar13 = atof(__nptr);
        fsnav_ins_attitude_madgwick::feedback_rate = dVar13 / (fsnav->imu_const).rad2deg;
      }
    }
  }
  else if ((((-1 < fsnav->mode) && (pfVar6 = fsnav->imu, (pfVar6->sol).L_valid != '\0')) &&
           (pfVar6->w_valid != '\0')) && (pfVar6->f_valid != '\0')) {
    dVar2 = pfVar6->t;
    bVar7 = 0.0 <= fsnav_ins_attitude_madgwick::t0;
    fsnav_ins_attitude_madgwick::t0 = dVar2;
    if (bVar7) {
      lVar9 = 0;
      do {
        adStack_90[lVar9] = pfVar6->w[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_98 = 0.0;
      lVar9 = 0;
      do {
        local_58[lVar9] = pfVar6->f[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      dVar10 = fsnav_linal_vnorm(local_58,3);
      pfVar6 = fsnav->imu;
      dVar12 = (pfVar6->sol).q[2];
      dVar11 = (pfVar6->sol).q[3];
      dVar3 = (pfVar6->sol).q[0];
      dVar4 = (pfVar6->sol).q[1];
      dVar14 = dVar4 * dVar11 - dVar3 * dVar12;
      dVar16 = 0.5 - dVar4 * dVar4;
      dVar18 = dVar3 * dVar4 + dVar12 * dVar11;
      dVar17 = dVar16 + -dVar12 * dVar12;
      dVar21 = dVar11 * 0.0;
      local_128 = dVar12 + dVar12;
      uStack_120 = 0;
      dVar20 = dVar12 * 0.0;
      dVar19 = dVar4 * 0.0;
      dVar15 = dVar11 * -0.0;
      local_118[0] = dVar21 - local_128;
      local_118[1] = dVar20 + dVar11 + dVar11;
      local_118[2] = (dVar12 * -0.0 + dVar19) - (dVar3 + dVar3);
      local_118[3] = dVar15 + dVar3 * 0.0 + dVar4 + dVar4;
      local_f8[0] = dVar4 + dVar4 + dVar15;
      local_d8[0] = dVar4 * -0.0 + dVar20;
      local_f8[1] = dVar3 + dVar3 + local_d8[0];
      local_f8[2] = dVar11 + dVar11 + dVar19;
      local_f8[3] = dVar15 + dVar3 * -0.0 + local_128;
      local_d8[1] = dVar4 * -4.0 + dVar3 * -0.0 + dVar21;
      local_d8[2] = dVar12 * -4.0 + dVar3 * 0.0 + dVar21;
      local_d8[3] = dVar19 + dVar20;
      lVar9 = 0;
      do {
        adStack_90[lVar9 + 3] =
             local_d8[lVar9] *
             ((dVar17 + dVar17 +
              (dVar3 * dVar12 + dVar4 * dVar11) * 0.0 + (dVar12 * dVar11 - dVar3 * dVar4) * 0.0) -
             local_58[2] / dVar10) +
             local_118[lVar9] *
             ((dVar14 + dVar14 +
              (-dVar12 * dVar12 + 0.5 + -dVar11 * dVar11) * 0.0 +
              (dVar3 * dVar11 + dVar12 * dVar4) * 0.0) - local_58[0] / dVar10) +
             local_f8[lVar9] *
             ((dVar18 + dVar18 +
              (dVar12 * dVar4 - dVar3 * dVar11) * 0.0 + (-dVar11 * dVar11 + dVar16) * 0.0) -
             local_58[1] / dVar10);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      fsnav_linal_qmul(local_38,(pfVar6->sol).q,&local_98);
      lVar9 = 0;
      do {
        dVar12 = local_38[lVar9];
        local_128 = fsnav_ins_attitude_madgwick::feedback_rate * adStack_90[lVar9 + 3];
        dVar11 = fsnav_linal_vnorm(adStack_90 + 3,4);
        (fsnav->imu->sol).q[lVar9] =
             (dVar12 - local_128 / (dVar11 + 9.5367431640625e-07)) * 0.5 * (dVar2 - dVar13) +
             (fsnav->imu->sol).q[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      dVar12 = fsnav_linal_vnorm((fsnav->imu->sol).q,4);
      pfVar6 = fsnav->imu;
      lVar9 = 0;
      do {
        (pfVar6->sol).q[lVar9] = (pfVar6->sol).q[lVar9] / dVar12;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      fsnav_linal_quat2mat(fsnav_ins_attitude_madgwick::L,(fsnav->imu->sol).q);
      pfVar6 = fsnav->imu;
      cVar5 = pfVar6->W_valid;
      lVar9 = 0;
      do {
        if (cVar5 == '\0') {
          dVar12 = 0.0;
        }
        else {
          dVar12 = pfVar6->W[lVar9];
        }
        local_148[lVar9] = dVar12;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      if ((fsnav->imu->sol).llh_valid != '\0') {
        dVar12 = (fsnav->imu_const).u;
        dVar11 = cos((fsnav->imu->sol).llh[1]);
        local_148[1] = dVar11 * dVar12 + local_148[1];
        dVar12 = (fsnav->imu_const).u;
        dVar11 = sin((fsnav->imu->sol).llh[1]);
        local_148[2] = dVar11 * dVar12 + local_148[2];
      }
      lVar9 = 0;
      do {
        local_148[lVar9] = local_148[lVar9] * (dVar2 - dVar13);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      fsnav_linal_eul2mat(fsnav_ins_attitude_madgwick::C,local_148);
      pdVar1 = fsnav_ins_attitude_madgwick::L;
      uVar8 = 0xfffffffffffffffd;
      do {
        local_148[0] = pdVar1[uVar8 + 3];
        local_148[1] = pdVar1[uVar8 + 4];
        local_148[2] = pdVar1[uVar8 + 5];
        pdVar1[uVar8 + 3] =
             local_148[2] * fsnav_ins_attitude_madgwick::C[2] +
             local_148[0] * fsnav_ins_attitude_madgwick::C[0] +
             local_148[1] * fsnav_ins_attitude_madgwick::C[1];
        pdVar1[uVar8 + 4] =
             local_148[2] * fsnav_ins_attitude_madgwick::C[5] +
             local_148[0] * fsnav_ins_attitude_madgwick::C[3] +
             local_148[1] * fsnav_ins_attitude_madgwick::C[4];
        pdVar1[uVar8 + 5] =
             local_148[2] * fsnav_ins_attitude_madgwick::C[8] +
             local_148[0] * fsnav_ins_attitude_madgwick::C[6] +
             local_148[1] * fsnav_ins_attitude_madgwick::C[7];
        uVar8 = uVar8 + 3;
      } while (uVar8 < 6);
      fsnav_linal_mat2quat((fsnav->imu->sol).q,fsnav_ins_attitude_madgwick::L);
      pfVar6 = fsnav->imu;
      (pfVar6->sol).q_valid = '\x01';
      fsnav_linal_mat2rpy((pfVar6->sol).rpy,fsnav_ins_attitude_madgwick::L);
      (fsnav->imu->sol).rpy_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_attitude_madgwick(void) {

	static double t0 = -1;  // начальное время
	static double
		C[9],               // переходная матрица
		*L;                 // указатель на матрицу ориентации навигационного решения

	char *cfg_ptr;                      // указатель на параметр в строке конфигурации
	const char madgwick_token[] = "madgwick_feedback_rate";
	static double feedback_rate = -1;   // настраиваемый параметр, рад/сек, ~sqrt(3)*(остаточный дрейф гироскопов)
	const double epsilon = 1.0/1048576; // 2^-20 ~ 1e-6 

	double
		a[3],
		s,
		dt,                         // шаг времени
		w_madgwick[4],              // угловая скорость
		a_madgwick[3],              // измерения акселерометров
		J_madgwick[3][4],           // якобиан
		f_madgwick[3],              // целевая функция
		vector1_4[4],               // grad(f)
		vector2_4[4];               // 2*dq/dt
	size_t i;                       // индекс

	// инициализация
	if (fsnav->mode == 0) {

		// проверка инерциальной подсистемы на шине
		if (fsnav->imu == NULL)
			return;
		// сброс флагов достоверности
		fsnav->imu->sol.q_valid = 0;
		fsnav->imu->sol.L_valid = 0;
		fsnav->imu->sol.rpy_valid = 0;
		// указатель на матрицу ориентации imu->sol
		L = fsnav->imu->sol.L;
		// единичный кватернион
		for (i = 1, fsnav->imu->sol.q[0] = 1; i < 4; i++)
			fsnav->imu->sol.q[i] = 0;
		fsnav->imu->sol.q_valid = 1;
		// матрица ориентации
		fsnav_linal_quat2mat(L, fsnav->imu->sol.q);
		fsnav->imu->sol.L_valid = 1;
		// углы ориентации, соответствующие матрице ориентации
		fsnav_linal_mat2rpy(fsnav->imu->sol.rpy, L);
		fsnav->imu->sol.rpy_valid = 1;
		// обнуление начального времени
		t0 = -1;

		cfg_ptr = fsnav_locate_token(madgwick_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			feedback_rate = atof(cfg_ptr)/fsnav->imu_const.rad2deg;
		else
			return;

	}

	// завершение работы
	else if (fsnav->mode < 0) {}
	
	// операции на каждом шаге
	else {
		// проверка достоверности необходимых данных
		if (!fsnav->imu->sol.L_valid || !fsnav->imu->w_valid || !fsnav->imu->f_valid)
			return;
		// временнЫе переменные
		if (t0 < 0) {
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;

		for (i = 0, w_madgwick[0] = 0; i < 3; i++)
			w_madgwick[i+1] = fsnav->imu->w[i];

		for (i = 0, w_madgwick[0] = 0; i < 3; i++)
			a_madgwick[i] = fsnav->imu->f[i];

		double g0 = 0;
		double g1 = 0;
		double g2 = 1.0;
		// формирование целевой функции
		s = fsnav_linal_vnorm(a_madgwick, 3);
		f_madgwick[0] = 2.0*g0*(0.5 - fsnav->imu->sol.q[2]*fsnav->imu->sol.q[2] - fsnav->imu->sol.q[3]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[3] + fsnav->imu->sol.q[1]*fsnav->imu->sol.q[2])
		              + 2.0*g2*(      fsnav->imu->sol.q[1]*fsnav->imu->sol.q[3] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[2]) - a_madgwick[0]/s;
		f_madgwick[1] = 2.0*g0*(      fsnav->imu->sol.q[1]*fsnav->imu->sol.q[2] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(0.5 - fsnav->imu->sol.q[1]*fsnav->imu->sol.q[1] - fsnav->imu->sol.q[3]*fsnav->imu->sol.q[3])
		              + 2.0*g2*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[1] + fsnav->imu->sol.q[2]*fsnav->imu->sol.q[3]) - a_madgwick[1]/s;
		f_madgwick[2] = 2.0*g0*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[2] + fsnav->imu->sol.q[1]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(      fsnav->imu->sol.q[2]*fsnav->imu->sol.q[3] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[1])
		              + 2.0*g2*(0.5 - fsnav->imu->sol.q[1]*fsnav->imu->sol.q[1] - fsnav->imu->sol.q[2]*fsnav->imu->sol.q[2]) - a_madgwick[2]/s;
		// формирование якобиана
		J_madgwick[0][0] =  2.0*g1*fsnav->imu->sol.q[3] - 2.0*g2*fsnav->imu->sol.q[2]; 
		J_madgwick[0][1] =  2.0*g1*fsnav->imu->sol.q[2] + 2.0*g2*fsnav->imu->sol.q[3]; 
		J_madgwick[0][2] = -4.0*g0*fsnav->imu->sol.q[2] + 2.0*g1*fsnav->imu->sol.q[1] - 2.0*g2*fsnav->imu->sol.q[0]; 
		J_madgwick[0][3] = -4.0*g0*fsnav->imu->sol.q[3] + 2.0*g1*fsnav->imu->sol.q[0] + 2.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[1][0] = -2.0*g0*fsnav->imu->sol.q[3] + 2.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[1][1] =  2.0*g0*fsnav->imu->sol.q[2] - 4.0*g1*fsnav->imu->sol.q[1] + 2.0*g2*fsnav->imu->sol.q[0];
		J_madgwick[1][2] =  2.0*g0*fsnav->imu->sol.q[1] + 2.0*g2*fsnav->imu->sol.q[3];
		J_madgwick[1][3] = -2.0*g0*fsnav->imu->sol.q[0] - 4.0*g1*fsnav->imu->sol.q[3] + 2.0*g2*fsnav->imu->sol.q[2];
		J_madgwick[2][0] =  2.0*g0*fsnav->imu->sol.q[2] - 2.0*g1*fsnav->imu->sol.q[1];
		J_madgwick[2][1] =  2.0*g0*fsnav->imu->sol.q[3] - 2.0*g1*fsnav->imu->sol.q[0] - 4.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[2][2] =  2.0*g0*fsnav->imu->sol.q[0] + 2.0*g1*fsnav->imu->sol.q[3] - 4.0*g2*fsnav->imu->sol.q[2];
		J_madgwick[2][3] =  2.0*g0*fsnav->imu->sol.q[1] + 2.0*g1*fsnav->imu->sol.q[2];
		
		for (i = 0; i < 4; i++)
			vector1_4[i] = J_madgwick[0][i]*f_madgwick[0] + J_madgwick[1][i]*f_madgwick[1] + J_madgwick[2][i]*f_madgwick[2];

		fsnav_linal_qmul(vector2_4, fsnav->imu->sol.q, w_madgwick);
		// интегрирование
		for (i = 0; i < 4; i++) // для избежания деления на ноль
			fsnav->imu->sol.q[i] += 0.5*(vector2_4[i] - feedback_rate*vector1_4[i]/(epsilon + fsnav_linal_vnorm(vector1_4,4)))*dt;

		// норма
		s = fsnav_linal_vnorm(fsnav->imu->sol.q, 4);
		for (i = 0; i < 4; i++)
			fsnav->imu->sol.q[i] /= s;

		// L = L(q)
		fsnav_linal_quat2mat(L, fsnav->imu->sol.q);

		// опорный трёхгранник
		// a <- c = (W + u)*dt
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->W_valid ? fsnav->imu->W[i] : 0;
		if (fsnav->imu->sol.llh_valid) {
			a[1] += fsnav->imu_const.u*cos(fsnav->imu->sol.llh[1]);
			a[2] += fsnav->imu_const.u*sin(fsnav->imu->sol.llh[1]);
		}
		for (i = 0; i < 3; i++)
			a[i] *= dt;
		// L = L*(E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2)^T
		fsnav_linal_eul2mat(C, a);	// C = E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2
		for (i = 0; i < 9; i += 3) { // L = L*C^T
			a[0] = L[i+0];
			a[1] = L[i+1]; 
			a[2] = L[i+2];
			L[i+0] = a[0]*C[0] + a[1]*C[1] + a[2]*C[2];
			L[i+1] = a[0]*C[3] + a[1]*C[4] + a[2]*C[5];
			L[i+2] = a[0]*C[6] + a[1]*C[7] + a[2]*C[8];
		}
		// обновление кватерниона ориентации
		fsnav_linal_mat2quat(fsnav->imu->sol.q, L);
		fsnav->imu->sol.q_valid = 1;
		// обновление углов ориентации
		fsnav_linal_mat2rpy(fsnav->imu->sol.rpy, L);
		fsnav->imu->sol.rpy_valid = 1;
	}
}